

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

string * Logger::pad(string *__return_storage_ptr__,string *str,uint length,char filler)

{
  ulong uVar1;
  char filler_local;
  uint length_local;
  string *str_local;
  
  uVar1 = std::__cxx11::string::length();
  if (uVar1 < length) {
    std::__cxx11::string::resize((ulong)str,(char)length);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

string Logger::pad(string str, unsigned int length, char filler) {
    if (str.length() < length) {
        str.resize(length, filler);
    }
    return str;
}